

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void TableSettingsHandler_ApplyAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  uint uVar1;
  ImGuiTable *pIVar2;
  long lVar3;
  
  uVar1 = (ctx->Tables).Buf.Size;
  for (lVar3 = 0; (ulong)uVar1 * 600 - lVar3 != 0; lVar3 = lVar3 + 600) {
    pIVar2 = (ctx->Tables).Buf.Data;
    (&pIVar2->IsSettingsRequestLoad)[lVar3] = true;
    *(undefined4 *)((long)pIVar2->RowBgColor + lVar3 + -0x34) = 0xffffffff;
  }
  return;
}

Assistant:

static void TableSettingsHandler_ApplyAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Tables.GetSize(); i++)
    {
        ImGuiTable* table = g.Tables.GetByIndex(i);
        table->IsSettingsRequestLoad = true;
        table->SettingsOffset = -1;
    }
}